

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

string * __thiscall
soul::SourceCodeOperations::ModuleDeclaration::getFullyQualifiedName_abi_cxx11_
          (string *__return_storage_ptr__,ModuleDeclaration *this)

{
  string sStack_88;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_68;
  
  (*(this->module->super_ASTObject)._vptr_ASTObject[0xe])(&local_68);
  IdentifierPath::toString_abi_cxx11_(&sStack_88,(IdentifierPath *)&local_68);
  Program::stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeOperations::ModuleDeclaration::getFullyQualifiedName() const
{
    return Program::stripRootNamespaceFromQualifiedPath (module.getFullyQualifiedDisplayPath().toString());
}